

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_22460c::BNTest_MPI_Test::TestBody(BNTest_MPI_Test *this)

{
  bool bVar1;
  char *pcVar2;
  BIGNUM *pBVar3;
  undefined4 extraout_var;
  Message *pMVar4;
  undefined4 extraout_var_00;
  pointer actual;
  pointer in_R9;
  AssertHelper local_1a0;
  Message local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_160;
  Message local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<BIGNUM> bn2;
  Message local_130;
  Bytes local_128;
  Bytes local_118;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  size_t mpi_len2;
  Message local_c8;
  unsigned_long local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  size_t mpi_len;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_48;
  UniquePtr<BIGNUM> bn;
  ScopedTrace gtest_trace_1269;
  MPITest *test;
  MPITest *__end1;
  MPITest *__begin1;
  MPITest (*__range1) [6];
  uint8_t scratch [8];
  BNTest_MPI_Test *this_local;
  
  __end1 = (MPITest *)&(anonymous_namespace)::kMPITests;
  scratch = (uint8_t  [8])this;
  while( true ) {
    if (__end1 == (MPITest *)
                  &testing::internal::TestFactoryImpl<(anonymous_namespace)::BNTest_Rand_Test>::
                   vtable) {
      return;
    }
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)
               ((long)&bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x4f5,__end1->base10);
    ASCIIToBIGNUM((anon_unknown_dwarf_22460c *)&local_48,__end1->base10);
    testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_68,&local_48,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_98,(internal *)local_68,(AssertionResult *)0x84bde6,"false","true",
                 (char *)in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4f7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_78,&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      testing::Message::~Message(&local_70);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
    if (!bVar1) {
      pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_48);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = BN_bn2mpi(pBVar3,(uchar *)0x0);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = extraout_var;
      local_c0 = 8;
      testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                ((internal *)local_b8,"mpi_len","sizeof(scratch)",
                 (unsigned_long *)&gtest_ar.message_,&local_c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar1) {
        testing::Message::Message(&local_c8);
        pMVar4 = testing::Message::operator<<
                           (&local_c8,(char (*) [30])"MPI size is too large to test");
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mpi_len2,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4fa,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&mpi_len2,pMVar4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mpi_len2);
        testing::Message::~Message(&local_c8);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
      if (!bVar1) {
        pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_48);
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = BN_bn2mpi(pBVar3,(uchar *)&__range1);
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = extraout_var_00;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_e8,"mpi_len","mpi_len2",(unsigned_long *)&gtest_ar.message_,
                   (unsigned_long *)&gtest_ar_1.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
        if (!bVar1) {
          testing::Message::Message(&local_f0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4fd,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_f0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
        Bytes::Bytes(&local_118,__end1->mpi,__end1->mpi_len);
        Bytes::Bytes(&local_128,(uint8_t *)&__range1,
                     (size_t)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                  ((EqHelper *)local_108,"Bytes(test.mpi, test.mpi_len)","Bytes(scratch, mpi_len)",
                   &local_118,&local_128);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
        if (!bVar1) {
          testing::Message::Message(&local_130);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&bn2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4fe,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&bn2,&local_130);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bn2);
          testing::Message::~Message(&local_130);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
        pBVar3 = BN_mpi2bn((uchar *)&__range1,
                           (int)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl,(BIGNUM *)0x0);
        std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,
                   (pointer)pBVar3);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_150,
                   (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
        if (!bVar1) {
          testing::Message::Message(&local_158);
          pMVar4 = testing::Message::operator<<(&local_158,(char (*) [16])"failed to parse");
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_3.message_,(internal *)local_150,(AssertionResult *)"bn2",
                     "false","true",(char *)in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_160,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x501,pcVar2);
          testing::internal::AssertHelper::operator=(&local_160,pMVar4);
          testing::internal::AssertHelper::~AssertHelper(&local_160);
          std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_158);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
        if (!bVar1) {
          in_R9 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_48);
          actual = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)
                              &gtest_ar__1.message_);
          AssertBIGNUMSEqual((anon_unknown_dwarf_22460c *)local_190,"\"BN_mpi2bn\"","bn.get()",
                             "bn2.get()","BN_mpi2bn",in_R9,actual);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
          if (!bVar1) {
            testing::Message::Message(&local_198);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x502,pcVar2);
            testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
            testing::internal::AssertHelper::~AssertHelper(&local_1a0);
            testing::Message::~Message(&local_198);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
          bVar1 = false;
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      }
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_48);
    testing::ScopedTrace::~ScopedTrace
              ((ScopedTrace *)
               ((long)&bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 7));
    if (bVar1) break;
    __end1 = __end1 + 1;
  }
  return;
}

Assistant:

TEST_F(BNTest, MPI) {
  uint8_t scratch[8];

  for (const auto &test : kMPITests) {
    SCOPED_TRACE(test.base10);
    bssl::UniquePtr<BIGNUM> bn(ASCIIToBIGNUM(test.base10));
    ASSERT_TRUE(bn);

    const size_t mpi_len = BN_bn2mpi(bn.get(), NULL);
    ASSERT_LE(mpi_len, sizeof(scratch)) << "MPI size is too large to test";

    const size_t mpi_len2 = BN_bn2mpi(bn.get(), scratch);
    EXPECT_EQ(mpi_len, mpi_len2);
    EXPECT_EQ(Bytes(test.mpi, test.mpi_len), Bytes(scratch, mpi_len));

    bssl::UniquePtr<BIGNUM> bn2(BN_mpi2bn(scratch, mpi_len, NULL));
    ASSERT_TRUE(bn2) << "failed to parse";
    EXPECT_BIGNUMS_EQUAL("BN_mpi2bn", bn.get(), bn2.get());
  }
}